

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excp_helper.c
# Opt level: O0

void raise_interrupt2(CPUX86State *env,int intno,int is_int,int error_code,int next_eip_addend,
                     uintptr_t retaddr)

{
  CPUState *cpu;
  CPUState *cs;
  uintptr_t retaddr_local;
  int next_eip_addend_local;
  int error_code_local;
  int is_int_local;
  int intno_local;
  CPUX86State *env_local;
  
  retaddr_local._0_4_ = next_eip_addend;
  retaddr_local._4_4_ = error_code;
  next_eip_addend_local = is_int;
  error_code_local = intno;
  _is_int_local = env;
  cpu = env_cpu(env);
  if (next_eip_addend_local == 0) {
    cpu_svm_check_intercept_param_x86_64
              (_is_int_local,error_code_local + 0x40,(long)retaddr_local._4_4_,retaddr);
    error_code_local =
         check_exception(_is_int_local,error_code_local,(int *)((long)&retaddr_local + 4),retaddr);
  }
  else {
    cpu_svm_check_intercept_param_x86_64(_is_int_local,0x75,0,retaddr);
  }
  cpu->exception_index = error_code_local;
  _is_int_local->error_code = retaddr_local._4_4_;
  _is_int_local->exception_is_int = next_eip_addend_local;
  _is_int_local->exception_next_eip = _is_int_local->eip + (long)(int)retaddr_local;
  cpu_loop_exit_restore_x86_64(cpu,retaddr);
}

Assistant:

static void QEMU_NORETURN raise_interrupt2(CPUX86State *env, int intno,
                                           int is_int, int error_code,
                                           int next_eip_addend,
                                           uintptr_t retaddr)
{
    CPUState *cs = env_cpu(env);

    if (!is_int) {
        cpu_svm_check_intercept_param(env, SVM_EXIT_EXCP_BASE + intno,
                                      error_code, retaddr);
        intno = check_exception(env, intno, &error_code, retaddr);
    } else {
        cpu_svm_check_intercept_param(env, SVM_EXIT_SWINT, 0, retaddr);
    }

    cs->exception_index = intno;
    env->error_code = error_code;
    env->exception_is_int = is_int;
    env->exception_next_eip = env->eip + next_eip_addend;
    cpu_loop_exit_restore(cs, retaddr);
}